

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::subject::
SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_and_fixing_Test::
~SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_and_fixing_Test
          (SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_and_fixing_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_ndf_with_Tenor_and_settlement_and_fixing)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=NDF,FixingDate=20190921,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,SettlementDate=20190923,Symbol=EURGBP,Tenor=1Y,User=fbennett",
            subject_factory.Fx().Stream().Ndf()
                    .LiquidityProvider("CSFX")
                    .CurrencyPair("EURGBP")
                    .Currency("EUR")
                    .Quantity(1000000)
                    .Tenor(Tenor::IN_1_YEAR)
                    .SettlementDate(new Date(2019, 9, 23))
                    .FixingDate(new Date(2019, 9, 21))
                    .CreateSubject()
                    .ToString().c_str());
}